

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 556_reverseWordsInAString.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  string s;
  string sStack_68;
  string local_48;
  string local_28 [32];
  
  std::__cxx11::string::string<std::allocator<char>>
            (local_28,"Let\'s take LeetCode contest",(allocator<char> *)&sStack_68);
  std::__cxx11::string::string((string *)&local_48,local_28);
  reverseWords(&sStack_68,&local_48);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&sStack_68);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&sStack_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string(local_28);
  return 0;
}

Assistant:

int main()
{
	string s="Let's take LeetCode contest";
	cout<<reverseWords(s)<<endl;
}